

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApproxCheck.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_3257::ApproxCheck::checkUseChain
          (ApproxCheck *this,Instruction *instr,int level,
          vector<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_> *history)

{
  pointer *pppVVar1;
  uint uVar2;
  iterator __position;
  iterator __position_00;
  ApproxCheck *instr_00;
  char cVar3;
  int iVar4;
  char *pcVar5;
  long lVar6;
  Instruction *vi_00;
  ApproxCheck *pAVar7;
  pointer ppIVar8;
  Instruction *pIVar9;
  bool bVar10;
  Instruction *vi;
  Value *evalAddrInst;
  string newopcode;
  string opcode;
  ApproxCheck *local_d8;
  int local_cc;
  Value *local_c8;
  uint local_bc;
  vector<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_> local_b8;
  long *local_a0 [2];
  long local_90 [2];
  vector<llvm::Value*,std::allocator<llvm::Value*>> *local_80;
  vector<llvm::Instruction*,std::allocator<llvm::Instruction*>> *local_78;
  ApproxCheck *local_70;
  vector<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_> local_68;
  long *local_50 [2];
  long local_40 [2];
  
  local_cc = level;
  pcVar5 = (char *)llvm::Instruction::getOpcodeName((byte)instr[0x10] - 0x1b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_50,pcVar5,(allocator<char> *)local_a0);
  pcVar5 = "store";
  iVar4 = std::__cxx11::string::compare((char *)local_50);
  if ((*(uint *)(instr + 0x14) >> 0x1e & 1) == 0) {
    pIVar9 = instr + -(ulong)(*(uint *)(instr + 0x14) << 5);
  }
  else {
    pIVar9 = *(Instruction **)(instr + -8);
  }
  vi_00 = (Instruction *)CONCAT71((int7)((ulong)pcVar5 >> 8),iVar4 == 0);
  local_cc = local_cc + 1;
  local_80 = (vector<llvm::Value*,std::allocator<llvm::Value*>> *)&this->addrList;
  local_78 = (vector<llvm::Instruction*,std::allocator<llvm::Instruction*>> *)history;
  local_70 = this;
  do {
    uVar2 = *(uint *)(instr + 0x14);
    if ((uVar2 >> 0x1e & 1) == 0) {
      lVar6 = (long)instr - (ulong)(uVar2 << 5);
    }
    else {
      lVar6 = *(long *)(instr + -8);
    }
    if (pIVar9 == (Instruction *)((ulong)(uVar2 << 5) + lVar6)) {
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      return;
    }
    if (((ulong)vi_00 & 1) == 0) {
      if (*(long *)pIVar9 == 0) goto LAB_0010414f;
      if (0x1a < *(byte *)(*(long *)pIVar9 + 0x10)) {
        pAVar7 = *(ApproxCheck **)pIVar9;
        local_bc = (uint)vi_00;
        if (pAVar7 == (ApproxCheck *)0x0) {
LAB_0010414f:
          __assert_fail("Val && \"isa<> used on a null pointer\"",
                        "/usr/lib/llvm-14/include/llvm/Support/Casting.h",0x5a,
                        "static bool llvm::isa_impl_cl<llvm::Instruction, llvm::Value *>::doit(const From *) [To = llvm::Instruction, From = llvm::Value *]"
                       );
        }
        if ((byte)pAVar7->field_0x10 < 0x1b) {
          pAVar7 = (ApproxCheck *)0x0;
        }
        local_d8 = pAVar7;
        markInstruction(pAVar7,vi_00);
        pcVar5 = (char *)llvm::Instruction::getOpcodeName((byte)local_d8->field_0x10 - 0x1b);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_a0,pcVar5,(allocator<char> *)&local_c8);
        iVar4 = std::__cxx11::string::compare((char *)local_a0);
        if (iVar4 == 0) {
          bVar10 = false;
        }
        else {
          std::vector<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>::vector
                    (&local_b8,history);
          bVar10 = local_b8.
                   super__Vector_base<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>.
                   _M_impl.super__Vector_impl_data._M_start <
                   local_b8.
                   super__Vector_base<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          ppIVar8 = local_b8.
                    super__Vector_base<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          if (bVar10) {
            do {
              cVar3 = llvm::Instruction::isIdenticalTo(*ppIVar8);
              if (cVar3 != '\0') break;
              bVar10 = ppIVar8 + 1 <
                       local_b8.
                       super__Vector_base<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              ppIVar8 = ppIVar8 + 1;
            } while (bVar10);
          }
          bVar10 = (bool)(bVar10 ^ 1);
          history = (vector<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_> *)local_78;
        }
        if ((iVar4 != 0) &&
           (local_b8.super__Vector_base<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
          operator_delete(local_b8.
                          super__Vector_base<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_b8.
                                super__Vector_base<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_b8.
                                super__Vector_base<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        pAVar7 = local_70;
        if (bVar10) {
          __position._M_current = *(Instruction ***)((long)history + 8);
          if (__position._M_current == *(Instruction ***)((long)history + 0x10)) {
            std::vector<llvm::Instruction*,std::allocator<llvm::Instruction*>>::
            _M_realloc_insert<llvm::Instruction*const&>
                      ((vector<llvm::Instruction*,std::allocator<llvm::Instruction*>> *)history,
                       __position,(Instruction **)&local_d8);
          }
          else {
            *__position._M_current = (Instruction *)local_d8;
            *(long *)((long)history + 8) = *(long *)((long)history + 8) + 8;
          }
          instr_00 = local_d8;
          std::vector<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>::vector
                    (&local_68,history);
          checkUseChain(pAVar7,(Instruction *)instr_00,local_cc,&local_68);
          if (local_68.super__Vector_base<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_68.
                            super__Vector_base<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_68.
                                  super__Vector_base<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_68.
                                  super__Vector_base<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
        }
        pcVar5 = "load";
        iVar4 = std::__cxx11::string::compare((char *)local_a0);
        if (iVar4 == 0) {
          local_c8 = findAddressDependency(local_d8,(Instruction *)pcVar5);
          bVar10 = isInAddrList(pAVar7,local_c8);
          if (!bVar10) {
            __position_00._M_current =
                 (pAVar7->addrList).
                 super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (__position_00._M_current ==
                (pAVar7->addrList).super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<llvm::Value*,std::allocator<llvm::Value*>>::
              _M_realloc_insert<llvm::Value*const&>(local_80,__position_00,&local_c8);
            }
            else {
              *__position_00._M_current = local_c8;
              pppVVar1 = &(pAVar7->addrList).
                          super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>._M_impl.
                          super__Vector_impl_data._M_finish;
              *pppVVar1 = *pppVVar1 + 1;
            }
          }
        }
        if (local_a0[0] != local_90) {
          operator_delete(local_a0[0],local_90[0] + 1);
        }
        vi_00 = (Instruction *)(ulong)local_bc;
      }
    }
    else {
      vi_00 = (Instruction *)0x0;
    }
    pIVar9 = pIVar9 + 0x20;
  } while( true );
}

Assistant:

void checkUseChain(Instruction* instr, int level, std::vector<Instruction*> history) {
			std::string opcode = instr->getOpcodeName();
			bool skipFirst = (opcode == "store");

			for (User::op_iterator i = instr->op_begin(); i != instr->op_end(); i++) {
				if (skipFirst) {
					skipFirst = false;
				} else if (isa<Instruction>(*i)) {
					Instruction *vi = dyn_cast<Instruction>(*i);
					markInstruction(vi);

					// Print
					// for (int j = 0; j < level; j++) { errs() << "\t"; }
					// errs() << "(" << level << ")" << *vi << "\n";

					std::string newopcode = vi->getOpcodeName();
					if (newopcode != "load" && !vectorContains(history, vi)) {
						history.push_back(vi);
						ApproxCheck::checkUseChain(vi, level + 1, history);
					}

					if (newopcode == "load") {
						// Found some "address" stored in memory.
						Value* evalAddrInst = findAddressDependency(vi);
						if(!isInAddrList(evalAddrInst)) {
							addrList.push_back(evalAddrInst);
						}
					}
				}
			}
		}